

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

string * __thiscall
absl::FormatDuration_abi_cxx11_(string *__return_storage_ptr__,absl *this,Duration d)

{
  double dVar1;
  DisplayUnit unit;
  DisplayUnit unit_00;
  DisplayUnit unit_01;
  DisplayUnit unit_02;
  DisplayUnit unit_03;
  DisplayUnit unit_04;
  undefined8 uVar2;
  bool bVar3;
  int64_t iVar4;
  Duration DVar5;
  Duration rhs;
  Duration rhs_00;
  Duration rhs_01;
  Duration rhs_02;
  Duration rhs_03;
  Duration den;
  Duration rhs_04;
  Duration den_00;
  Duration den_01;
  Duration den_02;
  Duration den_03;
  Duration den_04;
  Duration lhs;
  Duration lhs_00;
  Duration lhs_01;
  Duration lhs_02;
  Duration lhs_03;
  Duration num;
  Duration lhs_04;
  Duration num_00;
  Duration num_01;
  Duration num_02;
  Duration num_03;
  Duration num_04;
  char *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  char *in_stack_fffffffffffffb68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb70;
  allocator<char> *in_stack_fffffffffffffb90;
  char *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  allocator<char> local_61;
  int64_t local_60;
  uint32_t local_58;
  uint32_t local_50;
  undefined4 uStack_4c;
  uint32_t local_48;
  int64_t local_40;
  uint32_t local_38;
  int64_t local_30;
  Duration min_duration;
  Duration d_local;
  string *s;
  
  d_local.rep_hi_._0_4_ = (uint32_t)d.rep_hi_;
  min_duration._8_8_ = this;
  DVar5 = Seconds<long,_0>(-0x8000000000000000);
  local_60 = DVar5.rep_hi_;
  local_58 = DVar5.rep_lo_;
  local_50 = min_duration.rep_lo_;
  uStack_4c = min_duration._12_4_;
  lhs.rep_lo_ = (uint32_t)d_local.rep_hi_;
  lhs.rep_hi_ = min_duration._8_8_;
  rhs._12_4_ = 0;
  rhs.rep_hi_ = SUB128(DVar5._0_12_,0);
  rhs.rep_lo_ = SUB124(DVar5._0_12_,8);
  lhs._12_4_ = 0;
  local_48 = (uint32_t)d_local.rep_hi_;
  local_40 = local_60;
  local_38 = local_58;
  local_30 = local_60;
  min_duration.rep_hi_._0_4_ = local_58;
  bVar3 = operator==(lhs,rhs);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
    std::allocator<char>::~allocator(&local_61);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    uVar2 = min_duration._8_8_;
    DVar5 = ZeroDuration();
    lhs_00.rep_lo_ = (uint32_t)d_local.rep_hi_;
    lhs_00.rep_hi_ = uVar2;
    rhs_00._12_4_ = 0;
    rhs_00.rep_hi_ = SUB128(DVar5._0_12_,0);
    rhs_00.rep_lo_ = SUB124(DVar5._0_12_,8);
    lhs_00._12_4_ = 0;
    bVar3 = operator<(lhs_00,rhs_00);
    if (bVar3) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
      DVar5.rep_lo_ = (uint32_t)d_local.rep_hi_;
      DVar5.rep_hi_ = min_duration._8_8_;
      DVar5._12_4_ = 0;
      DVar5 = operator-(DVar5);
      min_duration._8_8_ = DVar5.rep_hi_;
      d_local.rep_hi_._0_4_ = DVar5.rep_lo_;
    }
    uVar2 = min_duration._8_8_;
    DVar5 = InfiniteDuration();
    lhs_01.rep_lo_ = (uint32_t)d_local.rep_hi_;
    lhs_01.rep_hi_ = uVar2;
    rhs_01._12_4_ = 0;
    rhs_01.rep_hi_ = SUB128(DVar5._0_12_,0);
    rhs_01.rep_lo_ = SUB124(DVar5._0_12_,8);
    lhs_01._12_4_ = 0;
    bVar3 = operator==(lhs_01,rhs_01);
    uVar2 = min_duration._8_8_;
    if (bVar3) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    }
    else {
      DVar5 = Seconds<int,_0>(1);
      lhs_02.rep_lo_ = (uint32_t)d_local.rep_hi_;
      lhs_02.rep_hi_ = uVar2;
      rhs_02._12_4_ = 0;
      rhs_02.rep_hi_ = SUB128(DVar5._0_12_,0);
      rhs_02.rep_lo_ = SUB124(DVar5._0_12_,8);
      lhs_02._12_4_ = 0;
      bVar3 = operator<(lhs_02,rhs_02);
      uVar2 = min_duration._8_8_;
      if (bVar3) {
        DVar5 = Microseconds<int,_0>(1);
        lhs_03.rep_lo_ = (uint32_t)d_local.rep_hi_;
        lhs_03.rep_hi_ = uVar2;
        rhs_03._12_4_ = 0;
        rhs_03.rep_hi_ = SUB128(DVar5._0_12_,0);
        rhs_03.rep_lo_ = SUB124(DVar5._0_12_,8);
        lhs_03._12_4_ = 0;
        bVar3 = operator<(lhs_03,rhs_03);
        uVar2 = min_duration._8_8_;
        if (bVar3) {
          DVar5 = Nanoseconds<int,_0>(1);
          num.rep_lo_ = (uint32_t)d_local.rep_hi_;
          num.rep_hi_ = uVar2;
          den._12_4_ = 0;
          den.rep_hi_ = SUB128(DVar5._0_12_,0);
          den.rep_lo_ = SUB124(DVar5._0_12_,8);
          num._12_4_ = 0;
          dVar1 = FDivDuration(num,den);
          in_stack_fffffffffffffb58 = (char *)2;
          in_stack_fffffffffffffb60 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20a82e;
          unit.abbr._M_str = (char *)0x20a82e;
          unit.abbr._M_len = 2;
          unit._16_8_ = 2;
          unit.pow10 = (double)0x4059000000000000;
          anon_unknown_0::AppendNumberUnit(__return_storage_ptr__,dVar1,unit);
        }
        else {
          DVar5 = Milliseconds<int,_0>(1);
          lhs_04.rep_lo_ = (uint32_t)d_local.rep_hi_;
          lhs_04.rep_hi_ = uVar2;
          rhs_04._12_4_ = 0;
          rhs_04.rep_hi_ = SUB128(DVar5._0_12_,0);
          rhs_04.rep_lo_ = SUB124(DVar5._0_12_,8);
          lhs_04._12_4_ = 0;
          bVar3 = operator<(lhs_04,rhs_04);
          uVar2 = min_duration._8_8_;
          if (bVar3) {
            DVar5 = Microseconds<int,_0>(1);
            num_00.rep_lo_ = (uint32_t)d_local.rep_hi_;
            num_00.rep_hi_ = uVar2;
            den_00._12_4_ = 0;
            den_00.rep_hi_ = SUB128(DVar5._0_12_,0);
            den_00.rep_lo_ = SUB124(DVar5._0_12_,8);
            num_00._12_4_ = 0;
            dVar1 = FDivDuration(num_00,den_00);
            in_stack_fffffffffffffb58 = (char *)2;
            in_stack_fffffffffffffb60 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20deb8;
            unit_00.abbr._M_str = (char *)0x20deb8;
            unit_00.abbr._M_len = 2;
            unit_00._16_8_ = 5;
            unit_00.pow10 = (double)0x40f86a0000000000;
            anon_unknown_0::AppendNumberUnit(__return_storage_ptr__,dVar1,unit_00);
          }
          else {
            DVar5 = Milliseconds<int,_0>(1);
            num_01.rep_lo_ = (uint32_t)d_local.rep_hi_;
            num_01.rep_hi_ = uVar2;
            den_01._12_4_ = 0;
            den_01.rep_hi_ = SUB128(DVar5._0_12_,0);
            den_01.rep_lo_ = SUB124(DVar5._0_12_,8);
            num_01._12_4_ = 0;
            dVar1 = FDivDuration(num_01,den_01);
            in_stack_fffffffffffffb58 = (char *)2;
            in_stack_fffffffffffffb60 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x210184;
            unit_01.abbr._M_str = (char *)0x210184;
            unit_01.abbr._M_len = 2;
            unit_01._16_8_ = 8;
            unit_01.pow10 = (double)0x4197d78400000000;
            anon_unknown_0::AppendNumberUnit(__return_storage_ptr__,dVar1,unit_01);
          }
        }
      }
      else {
        DVar5 = Hours<int,_0>(1);
        num_02.rep_lo_ = (uint32_t)d_local.rep_hi_;
        num_02.rep_hi_ = uVar2;
        den_02._12_4_ = 0;
        den_02.rep_hi_ = SUB128(DVar5._0_12_,0);
        den_02.rep_lo_ = SUB124(DVar5._0_12_,8);
        num_02._12_4_ = 0;
        iVar4 = IDivDuration(num_02,den_02,(Duration *)&min_duration.rep_lo_);
        unit_02.abbr._M_str = (char *)0x20a8c8;
        unit_02.abbr._M_len = 1;
        unit_02._16_8_ = 0xffffffff;
        unit_02.pow10 = 0.0;
        anon_unknown_0::AppendNumberUnit(__return_storage_ptr__,iVar4,unit_02);
        uVar2 = min_duration._8_8_;
        DVar5 = Minutes<int,_0>(1);
        num_03.rep_lo_ = (uint32_t)d_local.rep_hi_;
        num_03.rep_hi_ = uVar2;
        den_03._12_4_ = 0;
        den_03.rep_hi_ = SUB128(DVar5._0_12_,0);
        den_03.rep_lo_ = SUB124(DVar5._0_12_,8);
        num_03._12_4_ = 0;
        iVar4 = IDivDuration(num_03,den_03,(Duration *)&min_duration.rep_lo_);
        unit_03.abbr._M_str = (char *)0x20ffe4;
        unit_03.abbr._M_len = 1;
        unit_03._16_8_ = 0xffffffff;
        unit_03.pow10 = 0.0;
        anon_unknown_0::AppendNumberUnit(__return_storage_ptr__,iVar4,unit_03);
        uVar2 = min_duration._8_8_;
        DVar5 = Seconds<int,_0>(1);
        num_04.rep_lo_ = (uint32_t)d_local.rep_hi_;
        num_04.rep_hi_ = uVar2;
        den_04._12_4_ = 0;
        den_04.rep_hi_ = SUB128(DVar5._0_12_,0);
        den_04.rep_lo_ = SUB124(DVar5._0_12_,8);
        num_04._12_4_ = 0;
        dVar1 = FDivDuration(num_04,den_04);
        in_stack_fffffffffffffb58 = (char *)1;
        in_stack_fffffffffffffb60 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20db64;
        unit_04.abbr._M_str = (char *)0x20db64;
        unit_04.abbr._M_len = 1;
        unit_04._16_8_ = 0xb;
        unit_04.pow10 = (double)0x42374876e8000000;
        anon_unknown_0::AppendNumberUnit(__return_storage_ptr__,dVar1,unit_04);
      }
    }
    bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1dc333
                      );
    if ((bVar3) ||
       (bVar3 = std::operator==(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58), bVar3)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatDuration(Duration d) {
  const Duration min_duration = Seconds(kint64min);
  if (d == min_duration) {
    // Avoid needing to negate kint64min by directly returning what the
    // following code should produce in that case.
    return "-2562047788015215h30m8s";
  }
  std::string s;
  if (d < ZeroDuration()) {
    s.append("-");
    d = -d;
  }
  if (d == InfiniteDuration()) {
    s.append("inf");
  } else if (d < Seconds(1)) {
    // Special case for durations with a magnitude < 1 second.  The duration
    // is printed as a fraction of a single unit, e.g., "1.2ms".
    if (d < Microseconds(1)) {
      AppendNumberUnit(&s, FDivDuration(d, Nanoseconds(1)), kDisplayNano);
    } else if (d < Milliseconds(1)) {
      AppendNumberUnit(&s, FDivDuration(d, Microseconds(1)), kDisplayMicro);
    } else {
      AppendNumberUnit(&s, FDivDuration(d, Milliseconds(1)), kDisplayMilli);
    }
  } else {
    AppendNumberUnit(&s, IDivDuration(d, Hours(1), &d), kDisplayHour);
    AppendNumberUnit(&s, IDivDuration(d, Minutes(1), &d), kDisplayMin);
    AppendNumberUnit(&s, FDivDuration(d, Seconds(1)), kDisplaySec);
  }
  if (s.empty() || s == "-") {
    s = "0";
  }
  return s;
}